

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

bool __thiscall cfd::core::KeyFormatData::IsFindVersion(KeyFormatData *this,uint32_t version)

{
  uint uVar1;
  const_reference cVar2;
  long lVar3;
  initializer_list<const_cfd::core::ExtkeyVersionPair_*> __l;
  allocator_type local_59;
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  cache_list;
  ExtkeyVersionPair *local_40;
  ExtkeyVersionPair *local_38;
  ExtkeyVersionPair *local_30;
  
  local_40 = &this->bip32_;
  local_38 = &this->bip49_;
  local_30 = &this->bip84_;
  __l._M_len = 3;
  __l._M_array = &local_40;
  ::std::
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::vector(&cache_list,__l,&local_59);
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    uVar1 = *(uint *)((long)&kFormatTypeList + lVar3);
    cVar2 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&this->has_format_,(ulong)uVar1);
    if ((cVar2) &&
       ((cache_list.
         super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar1]->pubkey_version == version ||
        (cache_list.
         super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar1]->privkey_version == version)))) break;
  }
  ::std::
  _Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::~_Vector_base(&cache_list.
                   super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                 );
  return lVar3 != 0xc;
}

Assistant:

bool KeyFormatData::IsFindVersion(uint32_t version) const {
  std::vector<const ExtkeyVersionPair *> cache_list = {
      &bip32_, &bip49_, &bip84_};
  for (const auto &type : kFormatTypeList) {
    if (has_format_[type]) {
      if ((cache_list[type]->pubkey_version == version) ||
          (cache_list[type]->privkey_version == version)) {
        return true;
      }
    }
  }
  return false;
}